

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::DecimalQuantity::readLongToBcd(DecimalQuantity *this,int64_t n)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  if (n < 10000000000000000) {
    if (n == 0) {
      uVar1 = 0;
      iVar2 = 0x10;
    }
    else {
      iVar2 = 0x10;
      uVar1 = 0;
      do {
        uVar1 = uVar1 >> 4 | (ulong)(uint)((int)n + (int)(n / 10) * -10) << 0x3c;
        iVar2 = iVar2 + -1;
        uVar3 = n + 9;
        n = n / 10;
      } while (0x12 < uVar3);
    }
    (this->fBCD).bcdLong = uVar1 >> ((char)iVar2 * '\x04' & 0x3fU);
    this->scale = 0;
    uVar1 = (ulong)(0x10 - iVar2);
  }
  else {
    ensureCapacity(this,0x28);
    uVar1 = 0;
    do {
      (this->fBCD).bcdBytes.ptr[uVar1] = (char)n + (char)(n / 10) * -10;
      uVar1 = uVar1 + 1;
      uVar3 = n + 9;
      n = n / 10;
    } while (0x12 < uVar3);
    this->scale = 0;
  }
  this->precision = (int32_t)uVar1;
  return;
}

Assistant:

void DecimalQuantity::readLongToBcd(int64_t n) {
    U_ASSERT(n != 0);
    if (n >= 10000000000000000L) {
        ensureCapacity();
        int i = 0;
        for (; n != 0L; n /= 10L, i++) {
            fBCD.bcdBytes.ptr[i] = static_cast<int8_t>(n % 10);
        }
        U_ASSERT(usingBytes);
        scale = 0;
        precision = i;
    } else {
        uint64_t result = 0L;
        int i = 16;
        for (; n != 0L; n /= 10L, i--) {
            result = (result >> 4) + ((n % 10) << 60);
        }
        U_ASSERT(i >= 0);
        U_ASSERT(!usingBytes);
        fBCD.bcdLong = result >> (i * 4);
        scale = 0;
        precision = 16 - i;
    }
}